

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.h
# Opt level: O1

void __thiscall Catch::XmlReporter::sectionStarting(XmlReporter *this,SectionInfo *sectionInfo)

{
  XmlWriter *this_00;
  int iVar1;
  string local_88;
  string local_68;
  string local_48;
  
  clara::std::vector<Catch::SectionInfo,_std::allocator<Catch::SectionInfo>_>::push_back
            (&(this->super_StreamingReporterBase<Catch::XmlReporter>).m_sectionStack,sectionInfo);
  iVar1 = this->m_sectionDepth;
  this->m_sectionDepth = iVar1 + 1;
  if (0 < iVar1) {
    this_00 = &this->m_xml;
    local_48._M_dataplus._M_p = (pointer)&local_48.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_48,"Section","");
    XmlWriter::startElement(this_00,&local_48,Newline|Indent);
    local_88._M_dataplus._M_p = (pointer)&local_88.field_2;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"name","");
    trim(&local_68,&sectionInfo->name);
    XmlWriter::writeAttribute(this_00,&local_88,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_48._M_dataplus._M_p != &local_48.field_2) {
      operator_delete(local_48._M_dataplus._M_p);
    }
    writeSourceInfo(this,&sectionInfo->lineInfo);
    XmlWriter::ensureTagClosed(this_00);
  }
  return;
}

Assistant:

void XmlReporter::sectionStarting( SectionInfo const& sectionInfo ) {
        StreamingReporterBase::sectionStarting( sectionInfo );
        if( m_sectionDepth++ > 0 ) {
            m_xml.startElement( "Section" )
                .writeAttribute( "name", trim( sectionInfo.name ) );
            writeSourceInfo( sectionInfo.lineInfo );
            m_xml.ensureTagClosed();
        }
    }